

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O2

int aom_decode_frame_from_obus(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,uint8_t **p_data_end)

{
  aom_internal_error_info *paVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint8_t uVar4;
  aom_codec_err_t aVar5;
  int iVar6;
  uint8_t *data_00;
  size_t sVar7;
  int i;
  size_t payload_size;
  size_t type_length;
  uint8_t **local_8c0;
  AV1_COMMON *local_8b0;
  uint8_t *local_8a0;
  YV12_BUFFER_CONFIG *local_898;
  aom_read_bit_buffer rb;
  ObuHeader obu_header;
  size_t bytes_read;
  uint *local_810;
  uint *local_808;
  EXTERNAL_REFERENCES *local_7e8;
  uint64_t type_value;
  int tile_width;
  
  obu_header.has_extension = 0;
  obu_header.temporal_layer_id = 0;
  obu_header.spatial_layer_id = 0;
  obu_header._28_4_ = 0;
  obu_header.size = 0;
  obu_header.type = 0;
  obu_header._9_3_ = 0;
  obu_header.has_size_field = 0;
  pbi->seen_frame_header = 0;
  pbi->next_start_tile = 0;
  pbi->num_tile_groups = 0;
  if (data_end < data) {
    (pbi->error).error_code = AOM_CODEC_CORRUPT_FRAME;
LAB_0017fc69:
    iVar6 = -1;
  }
  else {
    if ((pbi->common).tiles.large_scale == 0) {
      pbi->camera_frame_header_ready = 0;
    }
    local_8b0 = &pbi->common;
    paVar1 = &pbi->error;
    local_898 = &pbi->tile_list_outbuf;
    local_7e8 = &pbi->ext_refs;
    local_808 = &pbi->number_spatial_layers;
    local_810 = &pbi->number_temporal_layers;
    local_8c0 = p_data_end;
    local_8a0 = data;
    while (paVar1->error_code == AOM_CODEC_OK) {
      payload_size = 0;
      bytes_read = 0;
      if (((long)data_end - (long)data == 0) && (pbi->seen_frame_header == 0)) {
        *p_data_end = data;
        paVar1->error_code = AOM_CODEC_OK;
        return 0;
      }
      aVar5 = aom_read_obu_header_and_size
                        (data,(long)data_end - (long)data,pbi->is_annexb,&obu_header,&payload_size,
                         &bytes_read);
      if (aVar5 != AOM_CODEC_OK) {
        paVar1->error_code = aVar5;
        goto LAB_0017fc69;
      }
      (pbi->obu_size_hdr).data = data + obu_header.size;
      (pbi->obu_size_hdr).size = bytes_read - obu_header.size;
      data_00 = data + bytes_read;
      if ((ulong)((long)data_end - (long)data_00) < payload_size) {
LAB_0017fc61:
        paVar1->error_code = AOM_CODEC_CORRUPT_FRAME;
        goto LAB_0017fc69;
      }
      (pbi->common).temporal_layer_id = obu_header.temporal_layer_id;
      (pbi->common).spatial_layer_id = obu_header.spatial_layer_id;
      if ((((0xfd < (byte)(obu_header.type - OBU_FRAME_HEADER)) ||
           (uVar3 = pbi->current_operating_point, uVar3 == 0)) || (obu_header.has_extension == 0))
         || (((uVar3 >> (obu_header.temporal_layer_id & 0x1fU) & 1) != 0 &&
             ((uVar3 >> ((byte)((char)obu_header.spatial_layer_id + 8) & 0x1f) & 1) != 0)))) {
        av1_init_read_bit_buffer(pbi,&rb,data_00,data_00 + payload_size);
        sVar7 = payload_size;
        if (obu_header.type - 1 < 0xf) {
          iVar6 = (*(code *)(&DAT_00438d00 +
                            *(int *)(&DAT_00438d00 + (ulong)(obu_header.type - 1) * 4)))();
          return iVar6;
        }
        if (payload_size == 0) {
          sVar7 = 0;
        }
        else {
          uVar4 = get_last_nonzero_byte(data_00,payload_size);
          if ((uVar4 == '\0') || (payload_size < sVar7)) goto LAB_0017fc61;
        }
        while (payload_size != sVar7) {
          puVar2 = data_00 + sVar7;
          sVar7 = sVar7 + 1;
          if (*puVar2 != '\0') goto LAB_0017fc61;
        }
      }
      data = data_00 + payload_size;
    }
    iVar6 = -(uint)(paVar1->error_code != AOM_CODEC_OK);
  }
  return iVar6;
}

Assistant:

int aom_decode_frame_from_obus(struct AV1Decoder *pbi, const uint8_t *data,
                               const uint8_t *data_end,
                               const uint8_t **p_data_end) {
  AV1_COMMON *const cm = &pbi->common;
  int frame_decoding_finished = 0;
  int is_first_tg_obu_received = 1;
  // Whenever pbi->seen_frame_header is set to 1, frame_header is set to the
  // beginning of the frame_header_obu and frame_header_size is set to its
  // size. This allows us to check if a redundant frame_header_obu is a copy
  // of the previous frame_header_obu.
  //
  // Initialize frame_header to a dummy nonnull pointer, otherwise the Clang
  // Static Analyzer in clang 7.0.1 will falsely warn that a null pointer is
  // passed as an argument to a 'nonnull' parameter of memcmp(). The initial
  // value will not be used.
  const uint8_t *frame_header = data;
  uint32_t frame_header_size = 0;
  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  pbi->seen_frame_header = 0;
  pbi->next_start_tile = 0;
  pbi->num_tile_groups = 0;

  if (data_end < data) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return -1;
  }

  // Reset pbi->camera_frame_header_ready to 0 if cm->tiles.large_scale = 0.
  if (!cm->tiles.large_scale) pbi->camera_frame_header_ready = 0;

  // decode frame as a series of OBUs
  while (!frame_decoding_finished && pbi->error.error_code == AOM_CODEC_OK) {
    struct aom_read_bit_buffer rb;
    size_t payload_size = 0;
    size_t decoded_payload_size = 0;
    size_t obu_payload_offset = 0;
    size_t bytes_read = 0;
    const size_t bytes_available = data_end - data;

    if (bytes_available == 0 && !pbi->seen_frame_header) {
      *p_data_end = data;
      pbi->error.error_code = AOM_CODEC_OK;
      break;
    }

    aom_codec_err_t status =
        aom_read_obu_header_and_size(data, bytes_available, pbi->is_annexb,
                                     &obu_header, &payload_size, &bytes_read);

    if (status != AOM_CODEC_OK) {
      pbi->error.error_code = status;
      return -1;
    }

    // Record obu size header information.
    pbi->obu_size_hdr.data = data + obu_header.size;
    pbi->obu_size_hdr.size = bytes_read - obu_header.size;

    // Note: aom_read_obu_header_and_size() takes care of checking that this
    // doesn't cause 'data' to advance past 'data_end'.
    data += bytes_read;

    if ((size_t)(data_end - data) < payload_size) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return -1;
    }

    cm->temporal_layer_id = obu_header.temporal_layer_id;
    cm->spatial_layer_id = obu_header.spatial_layer_id;

    if (obu_header.type != OBU_TEMPORAL_DELIMITER &&
        obu_header.type != OBU_SEQUENCE_HEADER) {
      // don't decode obu if it's not in current operating mode
      if (!is_obu_in_current_operating_point(pbi, &obu_header)) {
        data += payload_size;
        continue;
      }
    }

    av1_init_read_bit_buffer(pbi, &rb, data, data + payload_size);

    switch (obu_header.type) {
      case OBU_TEMPORAL_DELIMITER:
        decoded_payload_size = read_temporal_delimiter_obu();
        if (pbi->seen_frame_header) {
          // A new temporal unit has started, but the frame in the previous
          // temporal unit is incomplete.
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        break;
      case OBU_SEQUENCE_HEADER:
        decoded_payload_size = read_sequence_header_obu(pbi, &rb);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        // The sequence header should not change in the middle of a frame.
        if (pbi->sequence_header_changed && pbi->seen_frame_header) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        break;
      case OBU_FRAME_HEADER:
      case OBU_REDUNDANT_FRAME_HEADER:
      case OBU_FRAME:
        if (obu_header.type == OBU_REDUNDANT_FRAME_HEADER) {
          if (!pbi->seen_frame_header) {
            pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
            return -1;
          }
        } else {
          // OBU_FRAME_HEADER or OBU_FRAME.
          if (pbi->seen_frame_header) {
            pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
            return -1;
          }
        }
        // Only decode first frame header received
        if (!pbi->seen_frame_header ||
            (cm->tiles.large_scale && !pbi->camera_frame_header_ready)) {
          frame_header_size = read_frame_header_obu(
              pbi, &rb, data, p_data_end, obu_header.type != OBU_FRAME);
          frame_header = data;
          pbi->seen_frame_header = 1;
          if (!pbi->ext_tile_debug && cm->tiles.large_scale)
            pbi->camera_frame_header_ready = 1;
        } else {
          // Verify that the frame_header_obu is identical to the original
          // frame_header_obu.
          if (frame_header_size > payload_size ||
              memcmp(data, frame_header, frame_header_size) != 0) {
            pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
            return -1;
          }
          assert(rb.bit_offset == 0);
          rb.bit_offset = 8 * frame_header_size;
        }

        decoded_payload_size = frame_header_size;
        pbi->frame_header_size = frame_header_size;
        cm->cur_frame->temporal_id = obu_header.temporal_layer_id;
        cm->cur_frame->spatial_id = obu_header.spatial_layer_id;

        if (cm->show_existing_frame) {
          if (obu_header.type == OBU_FRAME) {
            pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
            return -1;
          }
          frame_decoding_finished = 1;
          pbi->seen_frame_header = 0;

          if (cm->show_frame &&
              !cm->seq_params->order_hint_info.enable_order_hint) {
            ++cm->current_frame.frame_number;
          }
          break;
        }

        // In large scale tile coding, decode the common camera frame header
        // before any tile list OBU.
        if (!pbi->ext_tile_debug && pbi->camera_frame_header_ready) {
          frame_decoding_finished = 1;
          // Skip the rest of the frame data.
          decoded_payload_size = payload_size;
          // Update data_end.
          *p_data_end = data_end;
          break;
        }

        if (obu_header.type != OBU_FRAME) break;
        obu_payload_offset = frame_header_size;
        // Byte align the reader before reading the tile group.
        // byte_alignment() has set pbi->error.error_code if it returns -1.
        if (byte_alignment(cm, &rb)) return -1;
        AOM_FALLTHROUGH_INTENDED;  // fall through to read tile group.
      case OBU_TILE_GROUP:
        if (!pbi->seen_frame_header) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        if (obu_payload_offset > payload_size) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        decoded_payload_size += read_one_tile_group_obu(
            pbi, &rb, is_first_tg_obu_received, data + obu_payload_offset,
            data + payload_size, p_data_end, &frame_decoding_finished,
            obu_header.type == OBU_FRAME);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        is_first_tg_obu_received = 0;
        if (frame_decoding_finished) {
          pbi->seen_frame_header = 0;
          pbi->next_start_tile = 0;
        }
        pbi->num_tile_groups++;
        break;
      case OBU_METADATA: {
        decoded_payload_size =
            read_metadata(pbi, data, payload_size, obu_header.has_extension);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        break;
      }
      case OBU_TILE_LIST:
        if (CONFIG_NORMAL_TILE_MODE) {
          pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
          return -1;
        }

        // This OBU type is purely for the large scale tile coding mode.
        // The common camera frame header has to be already decoded.
        if (!pbi->camera_frame_header_ready) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }

        cm->tiles.large_scale = 1;
        av1_set_single_tile_decoding_mode(cm);
        decoded_payload_size =
            read_and_decode_one_tile_list(pbi, &rb, data, data + payload_size,
                                          p_data_end, &frame_decoding_finished);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        break;
      case OBU_PADDING:
        decoded_payload_size = read_padding(cm, data, payload_size);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        break;
      default:
        // Skip unrecognized OBUs
        if (payload_size > 0 &&
            get_last_nonzero_byte(data, payload_size) == 0) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        decoded_payload_size = payload_size;
        break;
    }

    // Check that the signalled OBU size matches the actual amount of data read
    if (decoded_payload_size > payload_size) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return -1;
    }

    // If there are extra padding bytes, they should all be zero
    while (decoded_payload_size < payload_size) {
      uint8_t padding_byte = data[decoded_payload_size++];
      if (padding_byte != 0) {
        pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
    }

    data += payload_size;
  }

  if (pbi->error.error_code != AOM_CODEC_OK) return -1;
  return frame_decoding_finished;
}